

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall capnp::JsonCodec::handleByAnnotation(JsonCodec *this,Schema schema)

{
  RemoveConst<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
  **ppRVar1;
  Impl *pIVar2;
  Entry *pEVar3;
  RemoveConst<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
  *pRVar4;
  SegmentReader *pSVar5;
  SegmentReader *pSVar6;
  void *pvVar7;
  CapTableReader *pCVar8;
  anon_union_8_2_eba6ea51_for_Type_5 aVar9;
  RemoveConst<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
  *pRVar10;
  StructSchema schema_00;
  size_t sVar11;
  SegmentReader *pSVar12;
  Type type;
  ArrayPtr<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry> table;
  Type type_00;
  Vector<capnp::Schema> dependencies;
  EnumSchema enumSchema;
  Schema local_b0;
  Reader local_a8;
  anon_union_8_2_eba6ea51_for_Type_5 local_78;
  Maybe<kj::StringPtr> local_70;
  Maybe<capnp::json::DiscriminatorOptions::Reader> local_58;
  
  local_b0.raw = schema.raw;
  Schema::getProto(&local_a8,&local_b0);
  if (0x6f < local_a8._reader.dataSize) {
    if (*(short *)((long)local_a8._reader.data + 0xc) == 2) {
      local_78 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asEnum(&local_b0);
      pIVar2 = (this->impl).ptr;
      pEVar3 = (pIVar2->annotatedEnumHandlers).table.rows.builder.ptr;
      sVar11 = (long)(pIVar2->annotatedEnumHandlers).table.rows.builder.pos - (long)pEVar3 >> 5;
      table.size_ = (size_t)pEVar3;
      table.ptr = (Entry *)&(pIVar2->annotatedEnumHandlers).table.indexes;
      kj::
      HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
      ::
      insert<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Entry,capnp::EnumSchema&>
                ((HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
                  *)&local_a8,table,sVar11,(EnumSchema *)sVar11);
      if (local_a8._reader.segment._0_1_ ==
          (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
           )0x0) {
        kj::heap<capnp::JsonCodec::AnnotatedEnumHandler,capnp::EnumSchema&>
                  ((kj *)&local_a8,(EnumSchema *)&local_78);
        type_00.field_4.schema = local_78.schema;
        type_00.baseType = ENUM;
        type_00.listDepth = '\0';
        type_00.isImplicitParam = false;
        type_00.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
        type_00._6_2_ = 0;
        addTypeHandlerImpl(this,type_00,(HandlerBase *)local_a8._reader.capTable);
        aVar9 = local_78;
        pRVar10 = (pIVar2->annotatedEnumHandlers).table.rows.builder.pos;
        if (pRVar10 == (pIVar2->annotatedEnumHandlers).table.rows.builder.endPtr) {
          pRVar4 = (pIVar2->annotatedEnumHandlers).table.rows.builder.ptr;
          sVar11 = 4;
          if (pRVar10 != pRVar4) {
            sVar11 = (long)pRVar10 - (long)pRVar4 >> 4;
          }
          kj::
          Vector<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
          ::setCapacity((Vector<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
                         *)&pIVar2->annotatedEnumHandlers,sVar11);
          pRVar10 = (pIVar2->annotatedEnumHandlers).table.rows.builder.pos;
        }
        (pRVar10->key).baseType = ENUM;
        (pRVar10->key).listDepth = '\0';
        (pRVar10->key).field_4.schema = (RawBrandedSchema *)aVar9;
        (pRVar10->value).disposer = (Disposer *)local_a8._reader.segment;
        (pRVar10->value).ptr = (AnnotatedEnumHandler *)local_a8._reader.capTable;
        ppRVar1 = &(pIVar2->annotatedEnumHandlers).table.rows.builder.pos;
        *ppRVar1 = *ppRVar1 + 1;
      }
    }
    else if (*(short *)((long)local_a8._reader.data + 0xc) == 1) {
      Schema::getProto(&local_a8,&local_b0);
      if ((local_a8._reader.dataSize < 0x40) || (*local_a8._reader.data != -0x5c0587ba06e6227d)) {
        local_a8._reader.segment = (SegmentReader *)0x0;
        local_a8._reader.capTable = (CapTableReader *)0x0;
        local_a8._reader.data = (void *)0x0;
        schema_00 = Schema::asStruct(&local_b0);
        local_58.ptr.isSet = false;
        local_70.ptr.isSet = false;
        loadAnnotatedHandler(this,schema_00,&local_58,&local_70,(Vector<capnp::Schema> *)&local_a8);
        pCVar8 = local_a8._reader.capTable;
        pSVar5 = local_a8._reader.segment;
        pSVar6 = (SegmentReader *)local_a8._reader.capTable;
        pvVar7 = local_a8._reader.data;
        for (pSVar12 = local_a8._reader.segment; pSVar12 != (SegmentReader *)pCVar8;
            pSVar12 = (SegmentReader *)&pSVar12->id) {
          local_a8._reader.segment = pSVar5;
          local_a8._reader.capTable = (CapTableReader *)pSVar6;
          local_a8._reader.data = pvVar7;
          handleByAnnotation(this,(RawBrandedSchema *)pSVar12->arena);
          pSVar5 = local_a8._reader.segment;
          pSVar6 = (SegmentReader *)local_a8._reader.capTable;
          pvVar7 = local_a8._reader.data;
        }
        if (pSVar5 != (SegmentReader *)0x0) {
          local_a8._reader.segment = (SegmentReader *)0x0;
          local_a8._reader.capTable = (CapTableReader *)0x0;
          local_a8._reader.data = (void *)0x0;
          (**(code **)*local_a8._reader.pointers)
                    (local_a8._reader.pointers,pSVar5,8,(long)pSVar6 - (long)pSVar5 >> 3,
                     (long)pvVar7 - (long)pSVar5 >> 3,0);
        }
      }
      else {
        aVar9 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct(&local_b0);
        type.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)
                       (anon_union_8_2_eba6ea51_for_Type_5)aVar9.schema;
        type.baseType = STRUCT;
        type.listDepth = '\0';
        type.isImplicitParam = false;
        type.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
        type._6_2_ = 0;
        addTypeHandlerImpl(this,type,(HandlerBase *)&handleByAnnotation::GLOBAL_HANDLER);
      }
    }
  }
  return;
}

Assistant:

void JsonCodec::handleByAnnotation(Schema schema) {
  switch (schema.getProto().which()) {
    case schema::Node::STRUCT: {
      if (schema.getProto().getId() == capnp::typeId<JsonValue>()) {
        // Special handler for JsonValue.
        static JsonValueHandler GLOBAL_HANDLER;
        addTypeHandler(schema.asStruct(), GLOBAL_HANDLER);
      } else {
        kj::Vector<Schema> dependencies;
        loadAnnotatedHandler(schema.asStruct(), nullptr, nullptr, dependencies);
        for (auto dep: dependencies) {
          handleByAnnotation(dep);
        }
      }
      break;
    }
    case schema::Node::ENUM: {
      auto enumSchema = schema.asEnum();
      impl->annotatedEnumHandlers.findOrCreate(enumSchema, [&]() {
        auto handler = kj::heap<AnnotatedEnumHandler>(enumSchema);
        addTypeHandler(enumSchema, *handler);
        return kj::HashMap<Type, kj::Own<AnnotatedEnumHandler>>::Entry {
            enumSchema, kj::mv(handler) };
      });
      break;
    }
    default:
      break;
  }
}